

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_zip_error mz_zip_set_last_error(mz_zip_archive *pZip,mz_zip_error err_num)

{
  mz_zip_error mVar1;
  
  if (pZip != (mz_zip_archive *)0x0) {
    mVar1 = pZip->m_last_error;
    pZip->m_last_error = err_num;
    return mVar1;
  }
  return MZ_ZIP_INVALID_PARAMETER;
}

Assistant:

mz_zip_error mz_zip_set_last_error(mz_zip_archive *pZip, mz_zip_error err_num)
{
    mz_zip_error prev_err;

    if (!pZip)
        return MZ_ZIP_INVALID_PARAMETER;

    prev_err = pZip->m_last_error;

    pZip->m_last_error = err_num;
    return prev_err;
}